

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdCloneHandle_Test::TestBody(cfdcapi_common_CfdCloneHandle_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_2;
  void *handle2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  void *handle;
  AssertionResult gtest_ar;
  int ret;
  bool *in_stack_fffffffffffffd98;
  AssertionResult *in_stack_fffffffffffffda0;
  CfdErrorCode *in_stack_fffffffffffffda8;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  char *in_stack_fffffffffffffdb8;
  void **in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined4 local_19c;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  undefined4 local_174;
  AssertionResult local_170;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  string local_138;
  AssertHelper local_118;
  Message local_110;
  undefined1 local_101;
  AssertionResult local_100;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_dc;
  AssertionResult local_d8;
  long local_c8;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_89;
  AssertionResult local_88;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_64;
  AssertionResult local_60;
  long local_50;
  AssertHelper local_48;
  Message local_40 [3];
  undefined4 local_24;
  AssertionResult local_20;
  int local_c;
  
  cfd::Initialize();
  local_c = CfdCloneHandle((void *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                           in_stack_fffffffffffffdc0);
  local_24 = 1;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (in_stack_fffffffffffffdb8,
             (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x31d512);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message((Message *)0x31d575);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31d5cd);
  local_50 = 0;
  local_c = CfdCloneHandle((void *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                           in_stack_fffffffffffffdc0);
  local_64 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (in_stack_fffffffffffffdb8,
             (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x31d69e);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x31d701);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31d756);
  local_89 = local_50 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(type *)0x31d787);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)&local_88,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message((Message *)0x31d880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31d8fb);
  local_c8 = 0;
  local_c = CfdCloneHandle((void *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                           in_stack_fffffffffffffdc0);
  local_dc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (in_stack_fffffffffffffdb8,
             (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x31d9c4);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x31da21);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31da76);
  local_101 = local_c8 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(type *)0x31daa7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_138,(internal *)&local_100,(AssertionResult *)"(NULL == handle2)","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    testing::Message::~Message((Message *)0x31db9a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31dc15);
  local_c = CfdCopyErrorState(in_stack_fffffffffffffdb8,
                              (void *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0))
  ;
  local_14c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (in_stack_fffffffffffffdb8,
             (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x31dcd2);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x31dd2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31dd84);
  local_c = CfdFreeHandle(in_stack_fffffffffffffda8);
  local_174 = 0;
  pAVar3 = &local_170;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (in_stack_fffffffffffffdb8,
             (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    in_stack_fffffffffffffdb8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x31de39);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x4e,in_stack_fffffffffffffdb8);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message((Message *)0x31de96);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31deeb);
  local_c = CfdFreeHandle(in_stack_fffffffffffffda8);
  local_19c = 0;
  pAVar3 = &local_198;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (in_stack_fffffffffffffdb8,
             (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             (CfdErrorCode *)pAVar3,(int *)in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x31dfa0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message((Message *)0x31dffd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31e052);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdCloneHandle) {
  cfd::Initialize();
  int ret = CfdCloneHandle(NULL, NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  void* handle = NULL;
  ret = CfdCloneHandle(NULL, &handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* handle2 = NULL;
  ret = CfdCloneHandle(handle, &handle2);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle2));

  ret = CfdCopyErrorState(handle, handle2);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle2);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}